

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O3

AssertionResult __thiscall
testing::internal::CmpHelperEQ
          (internal *this,char *expected_expression,char *actual_expression,BiggestInt expected,
          BiggestInt actual)

{
  String *extraout_RDX;
  String *extraout_RDX_00;
  AssertionResult AVar1;
  String local_48;
  String local_38;
  BiggestInt local_28;
  BiggestInt local_20;
  
  if (expected == actual) {
    *this = (internal)0x1;
    *(undefined8 *)(this + 8) = 0;
  }
  else {
    local_28 = actual;
    local_20 = expected;
    StreamableToString<long_long>((internal *)&local_38,&local_20);
    StreamableToString<long_long>((internal *)&local_48,&local_28);
    AVar1 = EqFailure(this,expected_expression,actual_expression,&local_38,&local_48,false);
    actual_expression = (char *)AVar1.message_.ptr_;
    if (local_48.c_str_ != (char *)0x0) {
      operator_delete__(local_48.c_str_);
      actual_expression = (char *)extraout_RDX;
    }
    if (local_38.c_str_ != (char *)0x0) {
      operator_delete__(local_38.c_str_);
      actual_expression = (char *)extraout_RDX_00;
    }
  }
  AVar1.message_.ptr_ = (String *)actual_expression;
  AVar1._0_8_ = this;
  return AVar1;
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                            const char* actual_expression,
                            BiggestInt expected,
                            BiggestInt actual) {
  if (expected == actual) {
    return AssertionSuccess();
  }

  return EqFailure(expected_expression,
                   actual_expression,
                   FormatForComparisonFailureMessage(expected, actual),
                   FormatForComparisonFailureMessage(actual, expected),
                   false);
}